

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O1

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,double len)

{
  double dVar1;
  double dVar2;
  point_base<double> *ppVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double __x;
  double __y;
  double dVar11;
  double local_98;
  
  vc->m_size = 0;
  dVar8 = v0->x;
  dVar1 = v0->y;
  __x = ((v1->y - dVar1) / len) * this->m_width;
  __y = ((v1->x - dVar8) / len) * this->m_width;
  if (this->m_line_cap == round_cap) {
    dVar8 = acos(this->m_width_abs / (0.125 / this->m_approx_scale + this->m_width_abs));
    iVar6 = (int)(3.141592653589793 / (dVar8 + dVar8));
    dVar8 = v0->x;
    dVar1 = v0->y;
    uVar5 = vc->m_size >> 6;
    if (vc->m_num_blocks <= uVar5) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar5);
    }
    dVar7 = 3.141592653589793 / (double)(iVar6 + 1);
    ppVar3 = vc->m_blocks[uVar5];
    uVar5 = vc->m_size;
    uVar4 = (ulong)((uVar5 & 0x3f) << 4);
    *(double *)((long)&ppVar3->x + uVar4) = dVar8 - __x;
    *(double *)((long)&ppVar3->y + uVar4) = dVar1 + __y;
    vc->m_size = uVar5 + 1;
    if (this->m_width_sign < 1) {
      local_98 = atan2(-__y,__x);
      if (0 < iVar6) {
        do {
          local_98 = local_98 - dVar7;
          dVar8 = v0->x;
          dVar9 = cos(local_98);
          dVar1 = this->m_width;
          dVar11 = v0->y;
          dVar10 = sin(local_98);
          dVar2 = this->m_width;
          uVar5 = vc->m_size >> 6;
          if (vc->m_num_blocks <= uVar5) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar5);
          }
          ppVar3 = vc->m_blocks[uVar5];
          uVar5 = vc->m_size;
          uVar4 = (ulong)((uVar5 & 0x3f) << 4);
          *(double *)((long)&ppVar3->x + uVar4) = dVar9 * dVar1 + dVar8;
          *(double *)((long)&ppVar3->y + uVar4) = dVar10 * dVar2 + dVar11;
          vc->m_size = uVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
    }
    else {
      local_98 = atan2(__y,-__x);
      if (0 < iVar6) {
        do {
          local_98 = local_98 + dVar7;
          dVar8 = v0->x;
          dVar9 = cos(local_98);
          dVar1 = this->m_width;
          dVar11 = v0->y;
          dVar10 = sin(local_98);
          dVar2 = this->m_width;
          uVar5 = vc->m_size >> 6;
          if (vc->m_num_blocks <= uVar5) {
            pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar5);
          }
          ppVar3 = vc->m_blocks[uVar5];
          uVar5 = vc->m_size;
          uVar4 = (ulong)((uVar5 & 0x3f) << 4);
          *(double *)((long)&ppVar3->x + uVar4) = dVar9 * dVar1 + dVar8;
          *(double *)((long)&ppVar3->y + uVar4) = dVar10 * dVar2 + dVar11;
          vc->m_size = uVar5 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
    }
    dVar7 = __x + v0->x;
    dVar11 = v0->y - __y;
    uVar5 = vc->m_size;
  }
  else {
    dVar7 = 0.0;
    dVar11 = 0.0;
    if (this->m_line_cap == square_cap) {
      dVar7 = __y * (double)this->m_width_sign;
      dVar11 = (double)this->m_width_sign * __x;
    }
    if (vc->m_num_blocks == 0) {
      pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,0);
    }
    ppVar3 = *vc->m_blocks;
    uVar5 = vc->m_size;
    uVar4 = (ulong)((uVar5 & 0x3f) << 4);
    *(double *)((long)&ppVar3->x + uVar4) = (dVar8 - __x) - dVar7;
    *(double *)((long)&ppVar3->y + uVar4) = (dVar1 + __y) - dVar11;
    uVar5 = uVar5 + 1;
    vc->m_size = uVar5;
    dVar7 = (__x + v0->x) - dVar7;
    dVar11 = (v0->y - __y) - dVar11;
  }
  uVar5 = uVar5 >> 6;
  if (vc->m_num_blocks <= uVar5) {
    pod_bvector<agg::point_base<double>,_6U>::allocate_block(vc,uVar5);
  }
  ppVar3 = vc->m_blocks[uVar5];
  uVar5 = vc->m_size;
  uVar4 = (ulong)((uVar5 & 0x3f) << 4);
  *(double *)((long)&ppVar3->x + uVar4) = dVar7;
  *(double *)((long)&ppVar3->y + uVar4) = dVar11;
  vc->m_size = uVar5 + 1;
  return;
}

Assistant:

void math_stroke<VC>::calc_cap(VC& vc,
                                   const vertex_dist& v0, 
                                   const vertex_dist& v1, 
                                   double len)
    {
        vc.remove_all();

        double dx1 = (v1.y - v0.y) / len;
        double dy1 = (v1.x - v0.x) / len;
        double dx2 = 0;
        double dy2 = 0;

        dx1 *= m_width;
        dy1 *= m_width;

        if(m_line_cap != round_cap)
        {
            if(m_line_cap == square_cap)
            {
                dx2 = dy1 * m_width_sign;
                dy2 = dx1 * m_width_sign;
            }
            add_vertex(vc, v0.x - dx1 - dx2, v0.y + dy1 - dy2);
            add_vertex(vc, v0.x + dx1 - dx2, v0.y - dy1 - dy2);
        }
        else
        {
            double da = acos(m_width_abs / (m_width_abs + 0.125 / m_approx_scale)) * 2;
            double a1;
            int i;
            int n = int(pi / da);

            da = pi / (n + 1);
            add_vertex(vc, v0.x - dx1, v0.y + dy1);
            if(m_width_sign > 0)
            {
                a1 = atan2(dy1, -dx1);
                a1 += da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 += da;
                }
            }
            else
            {
                a1 = atan2(-dy1, dx1);
                a1 -= da;
                for(i = 0; i < n; i++)
                {
                    add_vertex(vc, v0.x + cos(a1) * m_width, 
                                   v0.y + sin(a1) * m_width);
                    a1 -= da;
                }
            }
            add_vertex(vc, v0.x + dx1, v0.y - dy1);
        }
    }